

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O1

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::finalize(Fasttrack<std::shared_mutex> *this)

{
  shared_mutex *__rwlock;
  __int_type_conflict _Var1;
  undefined8 uVar2;
  int iVar3;
  int spin_count;
  uint uVar4;
  long lVar5;
  
  __rwlock = &this->g_lock;
  iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  if (iVar3 == 0x23) {
    uVar2 = std::__throw_system_error(0x23);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    _Unwind_Resume(uVar2);
  }
  uVar4 = 0;
  do {
    if (((this->vars_spl)._locked._M_base._M_i & 1U) == 0) {
      LOCK();
      _Var1 = (this->vars_spl)._locked._M_base._M_i;
      (this->vars_spl)._locked._M_base._M_i = true;
      UNLOCK();
      if ((_Var1 & 1U) == 0) {
        lVar5 = 0x440;
        do {
          phmap::container_internal::
          raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
          ::clear((raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                   *)((long)((this->allocs).
                             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             .
                             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             .sets_._M_elems + -1) + lVar5));
          lVar5 = lVar5 + 0x40;
        } while (lVar5 != 0x840);
        (this->vars_spl)._locked._M_base._M_i = false;
        phmap::container_internal::
        raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
        ::clear((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                 *)&this->locks);
        lVar5 = 0x8c0;
        do {
          phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
          ::clear((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                   *)((long)((this->allocs).
                             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             .
                             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             .sets_._M_elems + -1) + lVar5));
          lVar5 = lVar5 + 0x40;
        } while (lVar5 != 0xcc0);
        lVar5 = 0x40;
        do {
          phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::clear((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   *)((long)((this->allocs).
                             super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             .
                             super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             .sets_._M_elems + -1) + lVar5));
          lVar5 = lVar5 + 0x40;
        } while (lVar5 != 0x440);
        phmap::container_internal::
        raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
        ::clear((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                 *)&this->threads);
        if (this->log_flag == true) {
          process_log_output(this);
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        return;
      }
    }
    if (0xf < uVar4) {
      sched_yield();
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void finalize() final {
    std::lock_guard<LockT> lg1(g_lock);
    {
      std::lock_guard<ipc::spinlock> lg2(vars_spl);
      vars.clear();
    }
    locks.clear();
    happens_states.clear();
    allocs.clear();
    threads.clear();

    if (log_flag) {
      process_log_output();
    }
  }